

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O3

void pnga_add_patch(void *alpha,Integer g_a,Integer *alo,Integer *ahi,void *beta,Integer g_b,
                   Integer *blo,Integer *bhi,Integer g_c,Integer *clo,Integer *chi)

{
  int iVar1;
  long lVar2;
  Integer IVar3;
  Integer IVar4;
  Integer IVar5;
  logical lVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  char notrans;
  long local_ce8;
  Integer g_B;
  char *C_ptr;
  Integer g_A;
  char *B_ptr;
  char *A_ptr;
  Integer bndim;
  Integer andim;
  Integer local_ca8;
  Integer local_ca0;
  void *local_c98;
  void *local_c90;
  Integer atype;
  Integer local_c80;
  int local_c74;
  Integer ctype;
  Integer loC [7];
  Integer hiC [7];
  Integer hiB [7];
  Integer loB [7];
  Integer hiA [7];
  Integer loA [7];
  Integer btype;
  Integer ldC [7];
  Integer ldB [7];
  Integer ldA [7];
  Integer lod [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_a;
  _iterator_hdl hdl_b;
  _iterator_hdl hdl_c;
  
  g_B = g_b;
  g_A = g_a;
  local_ca8 = g_b;
  local_c98 = beta;
  local_c90 = alpha;
  local_c80 = pnga_nodeid();
  pnga_nnodes();
  notrans = 'n';
  bVar11 = _ga_sync_begin != 0;
  local_c74 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar11) {
    pnga_sync();
  }
  pnga_inquire(g_a,&atype,&andim,adims);
  pnga_inquire(local_ca8,&btype,&bndim,bdims);
  pnga_inquire(g_c,&ctype,&local_ce8,cdims);
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  if (0 < andim) {
    lVar10 = 0;
    lVar2 = andim;
    do {
      if ((alo[lVar10] < 1) || (adims[lVar10] < ahi[lVar10])) {
        pnga_error("g_a indices out of range ",g_a);
        lVar2 = andim;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar2);
  }
  IVar7 = local_ca8;
  local_ca0 = g_a;
  if (0 < bndim) {
    lVar10 = 0;
    lVar2 = bndim;
    do {
      if ((blo[lVar10] < 1) || (bdims[lVar10] < bhi[lVar10])) {
        pnga_error("g_b indices out of range ",IVar7);
        lVar2 = bndim;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < lVar2);
  }
  lVar10 = 1;
  lVar2 = 1;
  if (0 < local_ce8) {
    lVar2 = 0;
    lVar9 = local_ce8;
    do {
      if ((clo[lVar2] < 1) || (cdims[lVar2] < chi[lVar2])) {
        pnga_error("g_c indices out of range ",g_c);
        lVar9 = local_ce8;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < lVar9);
    lVar2 = 1;
    if (0 < lVar9) {
      lVar8 = 0;
      do {
        lVar2 = lVar2 * ((chi[lVar8] - clo[lVar8]) + 1);
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
  }
  if (0 < andim) {
    lVar10 = 1;
    lVar9 = 0;
    do {
      lVar10 = lVar10 * ((ahi[lVar9] - alo[lVar9]) + 1);
      lVar9 = lVar9 + 1;
    } while (andim != lVar9);
  }
  lVar9 = 1;
  if (0 < bndim) {
    lVar8 = 0;
    do {
      lVar9 = lVar9 * ((bhi[lVar8] - blo[lVar8]) + 1);
      lVar8 = lVar8 + 1;
    } while (bndim != lVar8);
  }
  if ((lVar10 != lVar2) || (lVar9 != lVar2)) {
    pnga_error("  capacities of patches do not match ",0);
  }
  IVar3 = pnga_total_blocks(local_ca0);
  IVar4 = pnga_total_blocks(local_ca8);
  IVar5 = pnga_total_blocks(g_c);
  IVar7 = local_c80;
  if (((IVar3 < 0) && (IVar4 < 0)) && (IVar5 < 0)) {
    pnga_distribution(g_A,local_c80,loA,hiA);
    pnga_distribution(g_B,IVar7,loB,hiB);
    pnga_distribution(g_c,IVar7,loC,hiC);
    IVar7 = andim;
    lVar2 = local_ce8;
    lVar6 = pnga_comp_patch(andim,loA,hiA,local_ce8,loC,hiC);
    if (lVar6 == 0) {
LAB_00124d1f:
      hdl_a.g_a = 0;
    }
    else {
      lVar6 = pnga_comp_patch(IVar7,alo,ahi,lVar2,clo,chi);
      hdl_a.g_a = 1;
      if (lVar6 == 0) goto LAB_00124d1f;
    }
    IVar7 = pnga_type_f2c(0x3f2);
    IVar3 = 1;
    pnga_gop(IVar7,&hdl_a,1,"&&");
    IVar7 = bndim;
    lVar2 = local_ce8;
    lVar6 = pnga_comp_patch(bndim,loB,hiB,local_ce8,loC,hiC);
    if ((lVar6 == 0) || (lVar6 = pnga_comp_patch(IVar7,blo,bhi,lVar2,clo,chi), lVar6 == 0)) {
      IVar3 = 0;
    }
    hdl_b.g_a = IVar3;
    IVar7 = pnga_type_f2c(0x3f2);
    pnga_gop(IVar7,&hdl_b,1,"&&");
    IVar7 = bndim;
    if (hdl_b.g_a != 0 && hdl_a.g_a != 0) {
      if ((andim != bndim) && (local_ce8 = bndim, andim < bndim)) {
        local_ce8 = andim;
      }
      lVar2 = local_ce8;
      lVar6 = pnga_comp_patch(andim,loA,hiA,local_ce8,loC,hiC);
      if (lVar6 == 0) {
        pnga_error(" A patch mismatch ",g_A);
        lVar2 = local_ce8;
        IVar7 = bndim;
      }
      lVar6 = pnga_comp_patch(IVar7,loB,hiB,lVar2,loC,hiC);
      if (lVar6 == 0) {
        pnga_error(" B patch mismatch ",g_B);
        lVar2 = local_ce8;
      }
      lVar6 = pnga_patch_intersect(clo,chi,loC,hiC,lVar2);
      if (lVar6 != 0) {
        pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        snga_add_patch_values(atype,local_c90,local_c98,local_ce8,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        pnga_release(g_A,loC,hiC);
        pnga_release(g_B,loC,hiC);
        pnga_release_update(g_c,loC,hiC);
      }
      goto LAB_00125137;
    }
    if (hdl_a.g_a == 0 && hdl_b.g_a != 0) {
      if (local_ca8 == g_c) {
        lVar6 = pnga_duplicate(local_ca8,&g_A,"temp");
        IVar7 = local_ca0;
        if (lVar6 == 0) {
          pnga_error("ga_dadd_patch: dup failed",0);
        }
        pnga_copy_patch(&notrans,IVar7,alo,ahi,g_A,clo,chi);
      }
      else {
        pnga_copy_patch(&notrans,local_ca0,alo,ahi,g_c,clo,chi);
        g_A = g_c;
      }
      andim = local_ce8;
      pnga_distribution(g_A,local_c80,loA,hiA);
      IVar7 = bndim;
      if ((andim != bndim) && (local_ce8 = bndim, andim < bndim)) {
        local_ce8 = andim;
      }
      lVar2 = local_ce8;
      lVar6 = pnga_comp_patch(andim,loA,hiA,local_ce8,loC,hiC);
      if (lVar6 == 0) {
        pnga_error(" A patch mismatch ",g_A);
        lVar2 = local_ce8;
        IVar7 = bndim;
      }
      lVar6 = pnga_comp_patch(IVar7,loB,hiB,lVar2,loC,hiC);
      if (lVar6 == 0) {
        pnga_error(" B patch mismatch ",g_B);
        lVar2 = local_ce8;
      }
      lVar6 = pnga_patch_intersect(clo,chi,loC,hiC,lVar2);
      if (lVar6 != 0) {
        pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        snga_add_patch_values(atype,local_c90,local_c98,local_ce8,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        pnga_release(g_A,loC,hiC);
        pnga_release(g_B,loC,hiC);
        pnga_release_update(g_c,loC,hiC);
      }
      IVar7 = g_A;
      if (local_ca8 != g_c) goto LAB_00125137;
    }
    else if (hdl_b.g_a == 0 && hdl_a.g_a != 0) {
      lVar6 = pnga_duplicate(g_c,&g_B,"temp");
      if (lVar6 == 0) {
        pnga_error("ga_dadd_patch: dup failed",0);
      }
      pnga_copy_patch(&notrans,local_ca8,blo,bhi,g_B,clo,chi);
      bndim = local_ce8;
      pnga_distribution(g_B,local_c80,loB,hiB);
      IVar7 = bndim;
      if ((andim != bndim) && (local_ce8 = bndim, andim < bndim)) {
        local_ce8 = andim;
      }
      lVar2 = local_ce8;
      lVar6 = pnga_comp_patch(andim,loA,hiA,local_ce8,loC,hiC);
      if (lVar6 == 0) {
        pnga_error(" A patch mismatch ",g_A);
        lVar2 = local_ce8;
        IVar7 = bndim;
      }
      lVar6 = pnga_comp_patch(IVar7,loB,hiB,lVar2,loC,hiC);
      if (lVar6 == 0) {
        pnga_error(" B patch mismatch ",g_B);
        lVar2 = local_ce8;
      }
      lVar6 = pnga_patch_intersect(clo,chi,loC,hiC,lVar2);
      IVar7 = g_B;
      if (lVar6 != 0) {
        pnga_access_ptr(g_A,loC,hiC,&A_ptr,ldA);
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        snga_add_patch_values(atype,local_c90,local_c98,local_ce8,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        pnga_release(g_A,loC,hiC);
        pnga_release(g_B,loC,hiC);
LAB_00125969:
        pnga_release_update(g_c,loC,hiC);
        IVar7 = g_B;
      }
    }
    else {
      if (hdl_a.g_a != 0 || hdl_b.g_a != 0) goto LAB_00125137;
      lVar6 = pnga_duplicate(g_c,&g_B,"temp");
      if (lVar6 == 0) {
        pnga_error("ga_dadd_patch: dup failed",0);
      }
      pnga_copy_patch(&notrans,local_ca8,blo,bhi,g_B,clo,chi);
      bndim = local_ce8;
      pnga_copy_patch(&notrans,local_ca0,alo,ahi,g_c,clo,chi);
      pnga_scale_patch(g_c,clo,chi,local_c90);
      lVar6 = pnga_patch_intersect(clo,chi,loC,hiC,local_ce8);
      IVar7 = g_B;
      if (lVar6 != 0) {
        pnga_access_ptr(g_B,loC,hiC,&B_ptr,ldB);
        pnga_access_ptr(g_c,loC,hiC,&C_ptr,ldC);
        snga_acc_patch_values(atype,local_c98,local_ce8,loC,hiC,ldC,B_ptr,C_ptr);
        pnga_release(g_B,loC,hiC);
        goto LAB_00125969;
      }
    }
  }
  else {
    lVar6 = pnga_duplicate(g_c,&g_A,"temp");
    if (lVar6 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&notrans,local_ca0,alo,ahi,g_A,clo,chi);
    andim = local_ce8;
    lVar6 = pnga_duplicate(g_c,&g_B,"temp");
    if (lVar6 == 0) {
      pnga_error("ga_dadd_patch: dup failed",0);
    }
    pnga_copy_patch(&notrans,local_ca8,blo,bhi,g_B,clo,chi);
    bndim = local_ce8;
    pnga_local_iterator_init(g_A,&hdl_a);
    pnga_local_iterator_init(g_B,&hdl_b);
    pnga_local_iterator_init(g_c,&hdl_c);
    iVar1 = pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC);
    if (iVar1 != 0) {
      do {
        pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
        pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
        lVar2 = local_ce8;
        if (0 < local_ce8) {
          memcpy(lod,loC,local_ce8 * 8);
        }
        lVar6 = pnga_patch_intersect(clo,chi,loC,hiC,lVar2);
        if (lVar6 != 0) {
          if (lVar2 < 2) {
            lVar10 = 1;
            lVar9 = 0;
          }
          else {
            lVar10 = 1;
            lVar9 = 0;
            lVar8 = 0;
            do {
              lVar9 = lVar9 + (loC[lVar8] - lod[lVar8]) * lVar10;
              lVar10 = lVar10 * ldC[lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar2 + -1 != lVar8);
          }
          if (ctype - 0x3e9U < 0x10) {
            lVar9 = (loC[lVar2 + -1] - lod[lVar2 + -1]) * lVar10 + lVar9;
            switch(ctype) {
            case 0x3e9:
            case 0x3eb:
              A_ptr = A_ptr + lVar9 * 4;
              lVar9 = lVar9 * 4;
              break;
            case 0x3ea:
            case 0x3ec:
            case 0x3ee:
            case 0x3f8:
              A_ptr = A_ptr + lVar9 * 8;
              lVar9 = lVar9 * 8;
              break;
            default:
              goto switchD_00125096_caseD_3ed;
            case 0x3ef:
              lVar9 = lVar9 * 0x10;
              A_ptr = A_ptr + lVar9;
            }
            B_ptr = B_ptr + lVar9;
            C_ptr = C_ptr + lVar9;
          }
          else {
switchD_00125096_caseD_3ed:
          }
          snga_add_patch_values(atype,local_c90,local_c98,lVar2,loC,hiC,ldC,A_ptr,B_ptr,C_ptr);
        }
        iVar1 = pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC);
      } while (iVar1 != 0);
    }
    pnga_destroy(g_A);
    IVar7 = g_B;
  }
  pnga_destroy(IVar7);
LAB_00125137:
  if (local_c74 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_add_patch(alpha, g_a, alo, ahi, beta,  g_b, blo, bhi,
                         g_c, clo, chi)
Integer g_a, *alo, *ahi;    /* patch of g_a */
Integer g_b, *blo, *bhi;    /* patch of g_b */
Integer g_c, *clo, *chi;    /* patch of g_c */
void *alpha, *beta;
{
  Integer i, j;
  Integer compatible_a, compatible_b;
  Integer atype, btype, ctype;
  Integer andim, adims[MAXDIM], bndim, bdims[MAXDIM], cndim, cdims[MAXDIM];
  Integer loA[MAXDIM], hiA[MAXDIM], ldA[MAXDIM];
  Integer loB[MAXDIM], hiB[MAXDIM], ldB[MAXDIM];
  Integer loC[MAXDIM], hiC[MAXDIM], ldC[MAXDIM];
  char *A_ptr, *B_ptr, *C_ptr;
  Integer n1dim;
  Integer atotal, btotal;
  Integer g_A = g_a, g_B = g_b;
  Integer me= pnga_nodeid(), A_created=0, B_created=0;
  Integer nproc = pnga_nnodes();
  Integer num_blocks_a, num_blocks_b, num_blocks_c;
  char *tempname = "temp", notrans='n';
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();


  pnga_inquire(g_a, &atype, &andim, adims);
  pnga_inquire(g_b, &btype, &bndim, bdims);
  pnga_inquire(g_c, &ctype, &cndim, cdims);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L); 

  /* check if patch indices and dims match */
  for(i=0; i<andim; i++)
    if(alo[i] <= 0 || ahi[i] > adims[i])
      pnga_error("g_a indices out of range ", g_a);
  for(i=0; i<bndim; i++)
    if(blo[i] <= 0 || bhi[i] > bdims[i])
      pnga_error("g_b indices out of range ", g_b);
  for(i=0; i<cndim; i++)
    if(clo[i] <= 0 || chi[i] > cdims[i])
      pnga_error("g_c indices out of range ", g_c);

  /* check if numbers of elements in patches match each other */
  n1dim = 1; for(i=0; i<cndim; i++) n1dim *= (chi[i] - clo[i] + 1);
  atotal = 1; for(i=0; i<andim; i++) atotal *= (ahi[i] - alo[i] + 1);
  btotal = 1; for(i=0; i<bndim; i++) btotal *= (bhi[i] - blo[i] + 1);

  if((atotal != n1dim) || (btotal != n1dim))
    pnga_error("  capacities of patches do not match ", 0L);

  num_blocks_a = pnga_total_blocks(g_a);
  num_blocks_b = pnga_total_blocks(g_b);
  num_blocks_c = pnga_total_blocks(g_c);

  if (num_blocks_a < 0 && num_blocks_b < 0 && num_blocks_c < 0) {
    /* find out coordinates of patches of g_a, g_b and g_c that I own */
    pnga_distribution( g_A, me, loA, hiA);
    pnga_distribution( g_B, me, loB, hiB);
    pnga_distribution( g_c, me, loC, hiC);

    /* test if the local portion of patches matches */
    if(pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC) &&
       pnga_comp_patch(andim, alo, ahi, cndim, clo, chi)) compatible_a = 1;
    else compatible_a = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_a, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_a, 1, "&&");
    if(pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC) &&
       pnga_comp_patch(bndim, blo, bhi, cndim, clo, chi)) compatible_b = 1;
    else compatible_b = 0;
    /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_b, 1, "*"); */
    pnga_gop(pnga_type_f2c(MT_F_INT), &compatible_b, 1, "&&");
    if (compatible_a && compatible_b) {
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (!compatible_a && compatible_b) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - do C<= A
       */
      if(g_b != g_c) {
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
        andim = cndim;
        g_A = g_c;
        pnga_distribution(g_A, me, loA, hiA);
      } else {
        if (!pnga_duplicate(g_c, &g_A, tempname))
          pnga_error("ga_dadd_patch: dup failed", 0L);
        pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
        andim = cndim;
        A_created = 1;
        pnga_distribution(g_A, me, loA, hiA);
      }
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (compatible_a && !compatible_b) {
      /* either patches or distributions do not match:
       *        - create a temp array that matches distribution of g_c
       *        - copy & reshape patch of g_b into g_B
       */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      pnga_distribution(g_B, me, loB, hiB);

      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;

      if(!pnga_comp_patch(andim, loA, hiA, cndim, loC, hiC))
        pnga_error(" A patch mismatch ", g_A); 
      if(!pnga_comp_patch(bndim, loB, hiB, cndim, loC, hiC))
        pnga_error(" B patch mismatch ", g_B);

      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else if (!compatible_a && !compatible_b) {
      /* there is no match between any of the global arrays */
      if (!pnga_duplicate(g_c, &g_B, tempname))
        pnga_error("ga_dadd_patch: dup failed", 0L);
      pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
      bndim = cndim;
      B_created = 1;
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      cndim = bndim;
      pnga_copy_patch(&notrans, g_a, alo, ahi, g_c, clo, chi);
      pnga_scale_patch(g_c, clo, chi, alpha);
      /*  determine subsets of my patches to access  */
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_acc_patch_values(atype, beta, cndim, loC, hiC, ldC,
                              B_ptr, C_ptr);
        /* release access to the data */
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    }
  } else {
    _iterator_hdl hdl_a, hdl_b, hdl_c;
    /* create copies of arrays A and B that are identically distributed
       as C*/
    if (!pnga_duplicate(g_c, &g_A, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_a, alo, ahi, g_A, clo, chi);
    andim = cndim;
    A_created = 1;

    if (!pnga_duplicate(g_c, &g_B, tempname))
      pnga_error("ga_dadd_patch: dup failed", 0L);
    pnga_copy_patch(&notrans, g_b, blo, bhi, g_B, clo, chi);
    bndim = cndim;
    B_created = 1;

#if 1
    pnga_local_iterator_init(g_A, &hdl_a);
    pnga_local_iterator_init(g_B, &hdl_b);
    pnga_local_iterator_init(g_c, &hdl_c);
    while (pnga_local_iterator_next(&hdl_c,loC,hiC,&C_ptr,ldC)) {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer offset, jtot, last;
      pnga_local_iterator_next(&hdl_a,loA,hiA,&A_ptr,ldA);
      pnga_local_iterator_next(&hdl_b,loB,hiB,&B_ptr,ldB);
      /* make temporary copies of loC and hiC since pnga_patch_intersect
         destroys original versions */
      for (j=0; j<cndim; j++) {
        lod[j] = loC[j];
        /*hid[j] = hiC[j];*/
      }
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {

        /* evaluate offsets for system */
        offset = 0;
        last = cndim - 1;
        jtot = 1;
        for (j=0; j<last; j++) {
          offset += (loC[j] - lod[j])*jtot;
          jtot *= ldC[j];
        }
        offset += (loC[last]-lod[last])*jtot;

        switch(ctype) {
          case C_DBL:
            A_ptr = (void*)((double*)(A_ptr) + offset);
            B_ptr = (void*)((double*)(B_ptr) + offset);
            C_ptr = (void*)((double*)(C_ptr) + offset);
            break;
          case C_INT:
            A_ptr = (void*)((int*)(A_ptr) + offset);
            B_ptr = (void*)((int*)(B_ptr) + offset);
            C_ptr = (void*)((int*)(C_ptr) + offset);
            break;
          case C_DCPL:
            A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
            break;
          case C_SCPL:
            A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
            B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
            C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
            break;
          case C_FLOAT:
            A_ptr = (void*)((float*)(A_ptr) + offset);
            B_ptr = (void*)((float*)(B_ptr) + offset);
            C_ptr = (void*)((float*)(C_ptr) + offset);
            break;
          case C_LONG:
            A_ptr = (void*)((long*)(A_ptr) + offset);
            B_ptr = (void*)((long*)(B_ptr) + offset);
            C_ptr = (void*)((long*)(C_ptr) + offset);
            break;
          case C_LONGLONG:
            A_ptr = (void*)((long long*)(A_ptr) + offset);
            B_ptr = (void*)((long long*)(B_ptr) + offset);
            C_ptr = (void*)((long long*)(C_ptr) + offset);
            break;
          default:
            break;
        }
        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);
      }
    }
#else
    /* C is normally distributed so just add copies together for regular
       arrays */
    if (num_blocks_c < 0) {
      pnga_distribution(g_c, me, loC, hiC);
      if(andim > bndim) cndim = bndim;
      if(andim < bndim) cndim = andim;
      if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)){
        pnga_access_ptr(g_A, loC, hiC, &A_ptr, ldA);
        pnga_access_ptr(g_B, loC, hiC, &B_ptr, ldB);
        pnga_access_ptr(g_c, loC, hiC, &C_ptr, ldC);

        snga_add_patch_values(atype, alpha, beta, cndim,
            loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

        /* release access to the data */
        pnga_release       (g_A, loC, hiC);
        pnga_release       (g_B, loC, hiC); 
        pnga_release_update(g_c, loC, hiC); 
      }
    } else {
      Integer idx, lod[MAXDIM]/*, hid[MAXDIM]*/;
      Integer offset, jtot, last;
      /* Simple block-cyclic data disribution */
      if (!pnga_uses_proc_grid(g_c)) {
        for (idx = me; idx < num_blocks_c; idx += nproc) {
          pnga_distribution(g_c, idx, loC, hiC);
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /*hid[j] = hiC[j];*/
          }
          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_ptr(g_A, idx, &A_ptr, ldA);
            pnga_access_block_ptr(g_B, idx, &B_ptr, ldB);
            pnga_access_block_ptr(g_c, idx, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;

            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                C_ptr = (void*)((long long*)(C_ptr) + offset);
                break;
              default:
                break;
            }
            snga_add_patch_values(atype, alpha, beta, cndim,
                loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

            /* release access to the data */
            pnga_release_block       (g_A, idx);
            pnga_release_block       (g_B, idx); 
            pnga_release_update_block(g_c, idx); 
          }
        }
      } else {
        /* Uses scalapack block-cyclic data distribution */
        Integer lod[MAXDIM]/*, hid[MAXDIM], chk*/;
        Integer proc_index[MAXDIM], index[MAXDIM];
        Integer topology[MAXDIM];
        Integer blocks[MAXDIM], block_dims[MAXDIM];
        pnga_get_proc_index(g_c, me, proc_index);
        pnga_get_proc_index(g_c, me, index);
        pnga_get_block_info(g_c, blocks, block_dims);
        pnga_get_proc_grid(g_c, topology);
        while (index[cndim-1] < blocks[cndim-1]) {
          /* find bounding coordinates of block */
          /*chk = 1;*/
          for (i = 0; i < cndim; i++) {
            loC[i] = index[i]*block_dims[i]+1;
            hiC[i] = (index[i] + 1)*block_dims[i];
            if (hiC[i] > cdims[i]) hiC[i] = cdims[i];
            /*if (hiC[i] < loC[i]) chk = 0;*/
          }
          /* make temporary copies of loC and hiC since pnga_patch_intersect
             destroys original versions */
          for (j=0; j<cndim; j++) {
            lod[j] = loC[j];
            /*hid[j] = hiC[j];*/
          }
          if (pnga_patch_intersect(clo, chi, loC, hiC, cndim)) {
            pnga_access_block_grid_ptr(g_A, index, &A_ptr, ldA);
            pnga_access_block_grid_ptr(g_B, index, &B_ptr, ldB);
            pnga_access_block_grid_ptr(g_c, index, &C_ptr, ldC);

            /* evaluate offsets for system */
            offset = 0;
            last = cndim - 1;
            jtot = 1;
            for (j=0; j<last; j++) {
              offset += (loC[j] - lod[j])*jtot;
              jtot *= ldC[j];
            }
            offset += (loC[last]-lod[last])*jtot;

            switch(ctype) {
              case C_DBL:
                A_ptr = (void*)((double*)(A_ptr) + offset);
                B_ptr = (void*)((double*)(B_ptr) + offset);
                C_ptr = (void*)((double*)(C_ptr) + offset);
                break;
              case C_INT:
                A_ptr = (void*)((int*)(A_ptr) + offset);
                B_ptr = (void*)((int*)(B_ptr) + offset);
                C_ptr = (void*)((int*)(C_ptr) + offset);
                break;
              case C_DCPL:
                A_ptr = (void*)((DoubleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((DoubleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((DoubleComplex*)(C_ptr) + offset);
                break;
              case C_SCPL:
                A_ptr = (void*)((SingleComplex*)(A_ptr) + offset);
                B_ptr = (void*)((SingleComplex*)(B_ptr) + offset);
                C_ptr = (void*)((SingleComplex*)(C_ptr) + offset);
                break;
              case C_FLOAT:
                A_ptr = (void*)((float*)(A_ptr) + offset);
                B_ptr = (void*)((float*)(B_ptr) + offset);
                C_ptr = (void*)((float*)(C_ptr) + offset);
                break;
              case C_LONG:
                A_ptr = (void*)((long*)(A_ptr) + offset);
                B_ptr = (void*)((long*)(B_ptr) + offset);
                C_ptr = (void*)((long*)(C_ptr) + offset);
                break;
              case C_LONGLONG:
                A_ptr = (void*)((long long*)(A_ptr) + offset);
                B_ptr = (void*)((long long*)(B_ptr) + offset);
                C_ptr = (void*)((long long*)(C_ptr) + offset);
                break;
              default:
                break;
            }
            snga_add_patch_values(atype, alpha, beta, cndim,
                loC, hiC, ldC, A_ptr, B_ptr, C_ptr);

            /* release access to the data */
            pnga_release_block_grid       ( g_A, index);
            pnga_release_block_grid       ( g_B, index); 
            pnga_release_update_block_grid(g_c, index); 
          }

          /* increment index to get next block on processor */
          index[0] += topology[0];
          for (i = 0; i < cndim; i++) {
            if (index[i] >= blocks[i] && i<cndim-1) {
              index[i] = proc_index[i];
              index[i+1] += topology[i+1];
            }
          }
        }
      }
    }
#endif
  }

  if(A_created) pnga_destroy(g_A);
  if(B_created) pnga_destroy(g_B);

  if(local_sync_end)pnga_sync();
}